

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CharStringType1Tracer.cpp
# Opt level: O3

EStatusCode __thiscall
CharStringType1Tracer::Type1VStem3(CharStringType1Tracer *this,LongList *inOperandList)

{
  string local_38;
  
  local_38._M_dataplus._M_p = (pointer)&local_38.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_38,"vstem3","");
  PrimitiveObjectsWriter::WriteKeyword(&this->mPrimitiveWriter,&local_38);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != &local_38.field_2) {
    operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
  }
  return eSuccess;
}

Assistant:

EStatusCode CharStringType1Tracer::Type1VStem3(const LongList& inOperandList)
{
	mPrimitiveWriter.WriteKeyword("vstem3");
	return PDFHummus::eSuccess;
}